

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O0

int __thiscall
stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::
executeThreads(MicrothreadManager<implementations::scheme::SchemeImplementation> *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  iterator it;
  bool unwatched_resolved;
  int threads_run;
  MicrothreadManager<implementations::scheme::SchemeImplementation> *this_local;
  
  it._M_node._4_4_ = 0;
  it._M_node._3_1_ = 0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>_>_>
       ::begin(&this->threads);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>_>_>
         ::end(&this->threads);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>_>
             ::operator->(&local_20);
    bVar1 = Microthread<implementations::scheme::SchemeImplementation>::isResolved(&ppVar2->second);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>_>
               ::operator->(&local_20);
      if (((ppVar2->second).super_MicrothreadBase.field_0xc & 1) == 0) {
        it._M_node._3_1_ = 1;
      }
    }
    else {
      bVar1 = isThreadScheduled(this,(_threads_iterator)local_20._M_node);
      if (bVar1) {
        bVar1 = executeThread(this,(_threads_iterator)local_20._M_node);
        if (bVar1) {
          it._M_node._4_4_ = it._M_node._4_4_ + 1;
        }
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>_>
                 ::operator->(&local_20);
        if (((ppVar2->second).super_MicrothreadBase.field_0xc & 1) == 0) {
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>_>
                   ::operator->(&local_20);
          bVar1 = Microthread<implementations::scheme::SchemeImplementation>::isResolved
                            (&ppVar2->second);
          if (bVar1) {
            it._M_node._3_1_ = 1;
          }
        }
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>_>
    ::operator++(&local_20);
  }
  if ((it._M_node._3_1_ & 1) != 0) {
    (**this->_vptr_MicrothreadManager)();
  }
  (*this->_vptr_MicrothreadManager[1])
            (this,(ulong)(it._M_node._3_1_ & 1),(ulong)it._M_node._4_4_,it._M_node._3_1_ & 1);
  return it._M_node._4_4_;
}

Assistant:

int executeThreads() {
				int threads_run = 0;
				bool unwatched_resolved = false;
				for (auto it = threads.begin(); it != threads.end(); ++it) {
					if (it->second.isResolved()) {
						if(it->second.watched == false)
							unwatched_resolved = true;
						continue;
					}
					if (isThreadScheduled(it) == false) {
						continue;
					}
					if(executeThread(it))
						++threads_run;
					if (it->second.watched == false && it->second.isResolved())
						unwatched_resolved = true;
				}
				if(unwatched_resolved)
					idle();
				yield_process(unwatched_resolved, threads_run);
				return threads_run;
			}